

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void ssl_calc_verify_ssl(mbedtls_ssl_context *ssl,uchar *hash)

{
  uchar local_138 [8];
  uchar pad_2 [48];
  uchar pad_1 [48];
  undefined1 local_cc [8];
  mbedtls_sha1_context sha1;
  mbedtls_md5_context md5;
  uchar *hash_local;
  mbedtls_ssl_context *ssl_local;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x3c1,"=> calc verify ssl");
  mbedtls_md5_init((mbedtls_md5_context *)(sha1.buffer + 0x38));
  mbedtls_sha1_init((mbedtls_sha1_context *)local_cc);
  mbedtls_md5_clone((mbedtls_md5_context *)(sha1.buffer + 0x38),&ssl->handshake->fin_md5);
  mbedtls_sha1_clone((mbedtls_sha1_context *)local_cc,&ssl->handshake->fin_sha1);
  memset(pad_2 + 0x28,0x36,0x30);
  memset(local_138,0x5c,0x30);
  mbedtls_md5_update((mbedtls_md5_context *)(sha1.buffer + 0x38),ssl->session_negotiate->master,0x30
                    );
  mbedtls_md5_update((mbedtls_md5_context *)(sha1.buffer + 0x38),pad_2 + 0x28,0x30);
  mbedtls_md5_finish((mbedtls_md5_context *)(sha1.buffer + 0x38),hash);
  mbedtls_md5_starts((mbedtls_md5_context *)(sha1.buffer + 0x38));
  mbedtls_md5_update((mbedtls_md5_context *)(sha1.buffer + 0x38),ssl->session_negotiate->master,0x30
                    );
  mbedtls_md5_update((mbedtls_md5_context *)(sha1.buffer + 0x38),local_138,0x30);
  mbedtls_md5_update((mbedtls_md5_context *)(sha1.buffer + 0x38),hash,0x10);
  mbedtls_md5_finish((mbedtls_md5_context *)(sha1.buffer + 0x38),hash);
  mbedtls_sha1_update((mbedtls_sha1_context *)local_cc,ssl->session_negotiate->master,0x30);
  mbedtls_sha1_update((mbedtls_sha1_context *)local_cc,pad_2 + 0x28,0x28);
  mbedtls_sha1_finish((mbedtls_sha1_context *)local_cc,hash + 0x10);
  mbedtls_sha1_starts((mbedtls_sha1_context *)local_cc);
  mbedtls_sha1_update((mbedtls_sha1_context *)local_cc,ssl->session_negotiate->master,0x30);
  mbedtls_sha1_update((mbedtls_sha1_context *)local_cc,local_138,0x28);
  mbedtls_sha1_update((mbedtls_sha1_context *)local_cc,hash + 0x10,0x14);
  mbedtls_sha1_finish((mbedtls_sha1_context *)local_cc,hash + 0x10);
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x3e0,"calculated verify result",hash,0x24);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x3e1,"<= calc verify");
  mbedtls_md5_free((mbedtls_md5_context *)(sha1.buffer + 0x38));
  mbedtls_sha1_free((mbedtls_sha1_context *)local_cc);
  return;
}

Assistant:

void ssl_calc_verify_ssl( mbedtls_ssl_context *ssl, unsigned char hash[36] )
{
    mbedtls_md5_context md5;
    mbedtls_sha1_context sha1;
    unsigned char pad_1[48];
    unsigned char pad_2[48];

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc verify ssl" ) );

    mbedtls_md5_init( &md5 );
    mbedtls_sha1_init( &sha1 );

    mbedtls_md5_clone( &md5, &ssl->handshake->fin_md5 );
    mbedtls_sha1_clone( &sha1, &ssl->handshake->fin_sha1 );

    memset( pad_1, 0x36, 48 );
    memset( pad_2, 0x5C, 48 );

    mbedtls_md5_update( &md5, ssl->session_negotiate->master, 48 );
    mbedtls_md5_update( &md5, pad_1, 48 );
    mbedtls_md5_finish( &md5, hash );

    mbedtls_md5_starts( &md5 );
    mbedtls_md5_update( &md5, ssl->session_negotiate->master, 48 );
    mbedtls_md5_update( &md5, pad_2, 48 );
    mbedtls_md5_update( &md5, hash,  16 );
    mbedtls_md5_finish( &md5, hash );

    mbedtls_sha1_update( &sha1, ssl->session_negotiate->master, 48 );
    mbedtls_sha1_update( &sha1, pad_1, 40 );
    mbedtls_sha1_finish( &sha1, hash + 16 );

    mbedtls_sha1_starts( &sha1 );
    mbedtls_sha1_update( &sha1, ssl->session_negotiate->master, 48 );
    mbedtls_sha1_update( &sha1, pad_2, 40 );
    mbedtls_sha1_update( &sha1, hash + 16, 20 );
    mbedtls_sha1_finish( &sha1, hash + 16 );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calculated verify result", hash, 36 );
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc verify" ) );

    mbedtls_md5_free(  &md5  );
    mbedtls_sha1_free( &sha1 );

    return;
}